

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::BasicBlock::MergeBlockIdIfAny(BasicBlock *this)

{
  bool bVar1;
  Op OVar2;
  Instruction *pIVar3;
  undefined1 local_28 [20];
  uint32_t mbid;
  const_iterator merge_ii;
  BasicBlock *this_local;
  
  merge_ii.node_ = (Instruction *)this;
  cend((BasicBlock *)(local_28 + 0x10));
  utils::IntrusiveList<spvtools::opt::Instruction>::
  iterator_template<const_spvtools::opt::Instruction>::operator--
            ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10));
  local_28._12_4_ = 0;
  cbegin((BasicBlock *)local_28);
  bVar1 = utils::operator!=((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10)
                            ,(iterator_template<const_spvtools::opt::Instruction> *)local_28);
  if (bVar1) {
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator--
              ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10));
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator->
                       ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10));
    OVar2 = opt::Instruction::opcode(pIVar3);
    if (OVar2 == OpLoopMerge) {
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<const_spvtools::opt::Instruction>::operator->
                         ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10));
      local_28._12_4_ = opt::Instruction::GetSingleWordInOperand(pIVar3,0);
    }
    else {
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<const_spvtools::opt::Instruction>::operator->
                         ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10));
      OVar2 = opt::Instruction::opcode(pIVar3);
      if (OVar2 == OpSelectionMerge) {
        pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<const_spvtools::opt::Instruction>::operator->
                           ((iterator_template<const_spvtools::opt::Instruction> *)(local_28 + 0x10)
                           );
        local_28._12_4_ = opt::Instruction::GetSingleWordInOperand(pIVar3,0);
      }
    }
  }
  return local_28._12_4_;
}

Assistant:

uint32_t BasicBlock::MergeBlockIdIfAny() const {
  auto merge_ii = cend();
  --merge_ii;
  uint32_t mbid = 0;
  if (merge_ii != cbegin()) {
    --merge_ii;
    if (merge_ii->opcode() == spv::Op::OpLoopMerge) {
      mbid = merge_ii->GetSingleWordInOperand(kLoopMergeMergeBlockIdInIdx);
    } else if (merge_ii->opcode() == spv::Op::OpSelectionMerge) {
      mbid = merge_ii->GetSingleWordInOperand(kSelectionMergeMergeBlockIdInIdx);
    }
  }

  return mbid;
}